

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strtod.cc
# Opt level: O3

double __thiscall
double_conversion::Strtod(double_conversion *this,Vector<const_char> buffer,int exponent)

{
  long in_FS_OFFSET;
  double dVar1;
  Vector<const_char> buffer_00;
  Vector<const_char> trimmed;
  int updated_exponent;
  char copy_buffer [780];
  int *in_stack_fffffffffffffc98;
  Vector<const_char> local_35c;
  undefined4 uStack_34c;
  char local_348 [784];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  memset(local_348,0xaa,0x30c);
  uStack_34c = 0xaaaaaaaa;
  local_35c._4_8_ = 0;
  local_35c._12_4_ = 0;
  local_35c.start_._0_4_ = -0x55555556;
  buffer_00._8_8_ = (ulong)buffer.start_ & 0xffffffff;
  buffer_00.start_ = (char *)this;
  TrimAndCut(buffer_00,buffer.length_,local_348,(int)&local_35c + 4,&local_35c,
             in_stack_fffffffffffffc98);
  trimmed.length_ = local_35c._12_4_;
  trimmed.start_ = (char *)local_35c._4_8_;
  trimmed._12_4_ = 0;
  dVar1 = StrtodTrimmed(trimmed,(int)local_35c.start_);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return dVar1;
  }
  __stack_chk_fail();
}

Assistant:

double Strtod(Vector<const char> buffer, int exponent) {
  char copy_buffer[kMaxSignificantDecimalDigits];
  Vector<const char> trimmed;
  int updated_exponent;
  TrimAndCut(buffer, exponent, copy_buffer, kMaxSignificantDecimalDigits,
             &trimmed, &updated_exponent);
  return StrtodTrimmed(trimmed, updated_exponent);
}